

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void __thiscall c4::yml::Parser::_end_stream(Parser *this)

{
  uint uVar1;
  pfn_error p_Var2;
  State *pSVar3;
  ulong uVar4;
  code *pcVar5;
  size_t sVar6;
  Location LVar7;
  Location LVar8;
  bool bVar9;
  NodeData *pNVar10;
  NodeType NVar11;
  size_t sVar12;
  Tree *pTVar13;
  type_bits more_flags;
  csubstr fmt;
  csubstr fmt_00;
  csubstr cVar14;
  char *pcStack_a0;
  size_t local_98;
  char *pcStack_78;
  size_t local_70;
  char msg [34];
  char cStack_46;
  char cStack_45;
  char cStack_44;
  char cStack_43;
  char cStack_42;
  char cStack_41;
  
  if ((this->m_stack).m_size == 0) {
    builtin_strncpy(msg + 0x10," m_stack.empty()",0x10);
    builtin_strncpy(msg,"check failed: (!",0x10);
    msg[0x20] = ')';
    msg[0x21] = '\0';
    if (((byte)s_error_flags & 1) != 0) {
      bVar9 = is_debugger_attached();
      if (bVar9) {
        pcVar5 = (code *)swi(3);
        (*pcVar5)();
        return;
      }
    }
    p_Var2 = (this->m_stack).m_callbacks.m_error;
    cVar14 = to_csubstr(
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       );
    local_70 = cVar14.len;
    pcStack_78 = cVar14.str;
    LVar7.super_LineCol.col = 0;
    LVar7.super_LineCol.offset = SUB168(ZEXT816(0x778f) << 0x40,0);
    LVar7.super_LineCol.line = SUB168(ZEXT816(0x778f) << 0x40,8);
    LVar7.name.str = pcStack_78;
    LVar7.name.len = local_70;
    (*p_Var2)(msg,0x22,LVar7,(this->m_stack).m_callbacks.m_user_data);
  }
  pSVar3 = this->m_state;
  if (((uint)pSVar3->flags >> 9 & 1) == 0) {
    if ((pSVar3->flags & 0x98U) == 0x88) {
      pNVar10 = _append_val_null(this,(pSVar3->line_contents).rem.str);
    }
    else {
      if (((this->m_val_tag).len == 0) || ((this->m_val_tag).str == (char *)0x0)) goto LAB_001bf2e9;
      pNVar10 = Tree::_p(this->m_tree,pSVar3->node_id);
      if (((pNVar10->m_type).type & DOC) == NOTYPE) {
        NVar11 = Tree::type(this->m_tree,this->m_state->node_id);
        if (NVar11.type != NOTYPE) goto LAB_001bf2e9;
      }
      sVar12 = this->m_state->node_id;
      pTVar13 = this->m_tree;
      more_flags = 0x10;
      cVar14.len = 0;
      cVar14.str = (this->m_state->line_contents).rem.str;
LAB_001bf1af:
      Tree::to_val(pTVar13,sVar12,cVar14,more_flags);
      pNVar10 = Tree::get(this->m_tree,this->m_state->node_id);
    }
  }
  else {
    pNVar10 = Tree::_p(this->m_tree,pSVar3->node_id);
    if (((pNVar10->m_type).type & SEQ) == NOTYPE) {
      pNVar10 = Tree::_p(this->m_tree,this->m_state->node_id);
      if (((pNVar10->m_type).type & MAP) == NOTYPE) {
        pNVar10 = Tree::_p(this->m_tree,this->m_state->node_id);
        if (((pNVar10->m_type).type & DOC) == NOTYPE) {
          NVar11 = Tree::type(this->m_tree,this->m_state->node_id);
          if (NVar11.type != NOTYPE) {
            bVar9 = is_debugger_attached();
            if (bVar9) {
              bVar9 = is_debugger_attached();
              if (bVar9) {
                pcVar5 = (code *)swi(3);
                (*pcVar5)();
                return;
              }
            }
            fmt.len = 0x15;
            fmt.str = "ERROR: internal error";
            _err<>(this,fmt);
            goto LAB_001bf2e9;
          }
        }
        uVar1 = this->m_state->flags;
        cVar14 = _consume_scalar(this);
        pTVar13 = this->m_tree;
        sVar12 = this->m_state->node_id;
        more_flags = (ulong)(uVar1 & 0x400) * 4 + 0x10;
        goto LAB_001bf1af;
      }
      pNVar10 = _append_key_val_null(this,(this->m_state->line_contents).rem.str);
    }
    else {
      cVar14 = _consume_scalar(this);
      pNVar10 = _append_val(this,cVar14,0);
    }
  }
  if (pNVar10 == (NodeData *)0x0) goto LAB_001bf2e9;
  sVar12 = Tree::id(this->m_tree,pNVar10);
  pNVar10 = Tree::_p(this->m_tree,this->m_state->node_id);
  if (((pNVar10->m_type).type & SEQ) == NOTYPE) {
    pNVar10 = Tree::_p(this->m_tree,this->m_state->node_id);
    if (((pNVar10->m_type).type & DOC) != NOTYPE) goto LAB_001bf212;
  }
  else {
LAB_001bf212:
    if (((this->m_key_anchor).len != 0) && ((this->m_key_anchor).str != (char *)0x0)) {
      sVar6 = (this->m_key_anchor).len;
      (this->m_val_anchor).str = (this->m_key_anchor).str;
      (this->m_val_anchor).len = sVar6;
      (this->m_key_anchor).str = (char *)0x0;
      (this->m_key_anchor).len = 0;
    }
    if (((this->m_key_tag).len != 0) && ((this->m_key_tag).str != (char *)0x0)) {
      sVar6 = (this->m_key_tag).len;
      (this->m_val_tag).str = (this->m_key_tag).str;
      (this->m_val_tag).len = sVar6;
      (this->m_key_tag).str = (char *)0x0;
      (this->m_key_tag).len = 0;
    }
  }
  if ((this->m_val_anchor).str != (char *)0x0 && (this->m_val_anchor).len != 0) {
    Tree::set_val_anchor(this->m_tree,sVar12,this->m_val_anchor);
    (this->m_val_anchor).str = (char *)0x0;
    (this->m_val_anchor).len = 0;
  }
  if ((this->m_val_tag).str != (char *)0x0 && (this->m_val_tag).len != 0) {
    pTVar13 = this->m_tree;
    cVar14 = normalize_tag(this->m_val_tag);
    Tree::set_val_tag(pTVar13,sVar12,cVar14);
    (this->m_val_tag).str = (char *)0x0;
    (this->m_val_tag).len = 0;
  }
LAB_001bf2e9:
  do {
    uVar4 = (this->m_stack).m_size;
    if (uVar4 < 2) {
      this->m_state->flags = this->m_state->flags | 0x1000;
      return;
    }
    if (((this->m_stack).m_stack[uVar4 - 1].flags & 0x200) != 0) {
      builtin_strncpy(msg + 0x10," has_any(SSCL, &m_",0x12);
      cStack_46 = 's';
      cStack_45 = 't';
      cStack_44 = 'a';
      cStack_43 = 'c';
      cStack_42 = 'k';
      cStack_41 = '.';
      builtin_strncpy(msg,"check failed: (!",0x10);
      if (((byte)s_error_flags & 1) != 0) {
        bVar9 = is_debugger_attached();
        if (bVar9) {
          pcVar5 = (code *)swi(3);
          (*pcVar5)();
          return;
        }
      }
      p_Var2 = (this->m_stack).m_callbacks.m_error;
      cVar14 = to_csubstr(
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         );
      local_98 = cVar14.len;
      pcStack_a0 = cVar14.str;
      LVar8.super_LineCol.col = 0;
      LVar8.super_LineCol.offset = SUB168(ZEXT816(0x77f1) << 0x40,0);
      LVar8.super_LineCol.line = SUB168(ZEXT816(0x77f1) << 0x40,8);
      LVar8.name.str = pcStack_a0;
      LVar8.name.len = local_98;
      (*p_Var2)(msg,0x30,LVar8,(this->m_stack).m_callbacks.m_user_data);
    }
    if ((~this->m_state->flags & 0x18U) == 0) {
      fmt_00.len = 0x13;
      fmt_00.str = "closing ] not found";
      _err<>(this,fmt_00);
    }
    _pop_level(this);
  } while( true );
}

Assistant:

void Parser::_end_stream()
{
    _c4dbgpf("end_stream, level={} node_id={}", m_state->level, m_state->node_id);
    _RYML_CB_ASSERT(m_stack.m_callbacks,  ! m_stack.empty());
    NodeData *added = nullptr;
    if(has_any(SSCL))
    {
        if(m_tree->is_seq(m_state->node_id))
        {
            _c4dbgp("append val...");
            added = _append_val(_consume_scalar());
        }
        else if(m_tree->is_map(m_state->node_id))
        {
            _c4dbgp("append null key val...");
            added = _append_key_val_null(m_state->line_contents.rem.str);
            #ifdef RYML_NO_COVERAGE__TO_BE_DELETED
            if(has_any(RSEQIMAP))
            {
                _stop_seqimap();
                _pop_level();
            }
            #endif
        }
        else if(m_tree->is_doc(m_state->node_id) || m_tree->type(m_state->node_id) == NOTYPE)
        {
            NodeType_e quoted = has_any(QSCL) ? VALQUO : NOTYPE; // do this before consuming the scalar
            csubstr scalar = _consume_scalar();
            _c4dbgpf("node[{}]: to docval '{}'{}", m_state->node_id, scalar, quoted == VALQUO ? ", quoted" : "");
            m_tree->to_val(m_state->node_id, scalar, DOC|quoted);
            added = m_tree->get(m_state->node_id);
        }
        else
        {
            _c4err("internal error");
        }
    }
    else if(has_all(RSEQ|RVAL) && has_none(FLOW))
    {
        _c4dbgp("add last...");
        added = _append_val_null(m_state->line_contents.rem.str);
    }
    else if(!m_val_tag.empty() && (m_tree->is_doc(m_state->node_id) || m_tree->type(m_state->node_id) == NOTYPE))
    {
        csubstr scalar = m_state->line_contents.rem.first(0);
        _c4dbgpf("node[{}]: add null scalar as docval", m_state->node_id);
        m_tree->to_val(m_state->node_id, scalar, DOC);
        added = m_tree->get(m_state->node_id);
    }

    if(added)
    {
        size_t added_id = m_tree->id(added);
        if(m_tree->is_seq(m_state->node_id) || m_tree->is_doc(m_state->node_id))
        {
            if(!m_key_anchor.empty())
            {
                _c4dbgpf("node[{}]: move key to val anchor: '{}'", added_id, m_key_anchor);
                m_val_anchor = m_key_anchor;
                m_key_anchor = {};
            }
            if(!m_key_tag.empty())
            {
                _c4dbgpf("node[{}]: move key to val tag: '{}'", added_id, m_key_tag);
                m_val_tag = m_key_tag;
                m_key_tag = {};
            }
        }
        #ifdef RYML_NO_COVERAGE__TO_BE_DELETED
        if(!m_key_anchor.empty())
        {
            _c4dbgpf("node[{}]: set key anchor='{}'", added_id, m_key_anchor);
            m_tree->set_key_anchor(added_id, m_key_anchor);
            m_key_anchor = {};
        }
        #endif
        if(!m_val_anchor.empty())
        {
            _c4dbgpf("node[{}]: set val anchor='{}'", added_id, m_val_anchor);
            m_tree->set_val_anchor(added_id, m_val_anchor);
            m_val_anchor = {};
        }
        #ifdef RYML_NO_COVERAGE__TO_BE_DELETED
        if(!m_key_tag.empty())
        {
            _c4dbgpf("node[{}]: set key tag='{}' -> '{}'", added_id, m_key_tag, normalize_tag(m_key_tag));
            m_tree->set_key_tag(added_id, normalize_tag(m_key_tag));
            m_key_tag = {};
        }
        #endif
        if(!m_val_tag.empty())
        {
            _c4dbgpf("node[{}]: set val tag='{}' -> '{}'", added_id, m_val_tag, normalize_tag(m_val_tag));
            m_tree->set_val_tag(added_id, normalize_tag(m_val_tag));
            m_val_tag = {};
        }
    }

    while(m_stack.size() > 1)
    {
        _c4dbgpf("popping level: {} (stack sz={})", m_state->level, m_stack.size());
        _RYML_CB_ASSERT(m_stack.m_callbacks,  ! has_any(SSCL, &m_stack.top()));
        if(has_all(RSEQ|FLOW))
            _err("closing ] not found");
        _pop_level();
    }
    add_flags(NDOC);
}